

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O2

string * StringPrintf_abi_cxx11_(string *__return_storage_ptr__,char *format,...)

{
  char local_1e8 [8];
  char buf [256];
  undefined8 local_38;
  va_list ap;
  
  ap[0].overflow_arg_area = buf + 0xf8;
  ap[0]._0_8_ = &stack0x00000008;
  local_38 = 0x3000000010;
  vsnprintf(local_1e8,0x100,format,&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_1e8,
             (allocator<char> *)((long)&ap[0].reg_save_area + 7));
  return __return_storage_ptr__;
}

Assistant:

static std::string StringPrintf(const char* format, ...) {
  char buf[256];   // should be big enough for all logging
  va_list ap;
  va_start(ap, format);
  vsnprintf(buf, sizeof(buf), format, ap);
  va_end(ap);
  return buf;
}